

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmDeviceInfo * Pm_GetDeviceInfo(PmDeviceID id)

{
  descriptor_type paStack_10;
  PmDeviceID id_local;
  
  Pm_Initialize();
  if ((id < 0) || (pm_descriptor_index <= id)) {
    paStack_10 = (descriptor_type)0x0;
  }
  else {
    paStack_10 = descriptors + id;
  }
  return &paStack_10->pub;
}

Assistant:

PMEXPORT const PmDeviceInfo* Pm_GetDeviceInfo( PmDeviceID id ) {
    Pm_Initialize(); /* no error check needed */
    if (id >= 0 && id < pm_descriptor_index) {
        return &descriptors[id].pub;
    }
    return NULL;
}